

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::ComputeShaderBase::ValidateReadBuffer
          (ComputeShaderBase *this,int x,int y,int w,int h,vec4 *expected)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  undefined4 in_register_0000000c;
  vec4 *epsilon;
  uint uVar4;
  ComputeShaderBase *this_00;
  int iVar5;
  size_type __n;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  allocator_type local_85;
  int local_84;
  uint local_80;
  uint local_7c;
  int local_78;
  int local_74;
  vec4 *local_70;
  ulong local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  
  local_70 = (vec4 *)CONCAT44(in_register_0000000c,w);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&display,(long)(y * x),(allocator_type *)&data);
  __n = (size_type)(y * x * 4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&data,__n,&local_85);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,x,y,0x1908,0x1401,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  auVar2 = _DAT_0167ea80;
  for (lVar3 = 0; lVar3 < (long)__n; lVar3 = lVar3 + 4) {
    uVar4 = *(uint *)(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_start + lVar3);
    auVar1[0xc] = (char)(uVar4 >> 0x18);
    auVar1._0_12_ = ZEXT712(0);
    auVar10._0_8_ = (double)(uVar4 & 0xff);
    auVar10._8_8_ = (double)(uVar4 >> 8 & 0xff);
    auVar9._0_8_ = (double)(int)CONCAT32(auVar1._10_3_,(ushort)(byte)(uVar4 >> 0x10));
    auVar9._8_8_ = (double)(uint3)(auVar1._10_3_ >> 0x10);
    auVar9 = divpd(auVar9,auVar2);
    auVar10 = divpd(auVar10,auVar2);
    *(ulong *)display.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[(int)lVar3 >> 2].m_data =
         CONCAT44((float)auVar10._8_8_,(float)auVar10._0_8_);
    *(ulong *)(display.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[(int)lVar3 >> 2].m_data + 2) =
         CONCAT44((float)auVar9._8_8_,(float)auVar9._0_8_);
  }
  iVar5 = 0;
  local_68 = 0;
  if (0 < x) {
    local_68 = (ulong)(uint)x;
  }
  epsilon = (vec4 *)0x0;
  if (0 < y) {
    epsilon = (vec4 *)(ulong)(uint)y;
  }
  uVar4 = 0;
  local_7c = (uint)epsilon;
  local_84 = y;
  local_78 = x;
  do {
    if (uVar4 == (uint)epsilon) {
LAB_00c219a4:
      bVar8 = local_84 <= (int)uVar4;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&display.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      return bVar8;
    }
    iVar6 = 1;
    uVar7 = local_68;
    local_80 = uVar4;
    local_74 = iVar5;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      this_00 = (ComputeShaderBase *)
                (display.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + iVar5);
      bVar8 = ColorEqual(this_00,local_70,&this->g_color_eps,epsilon);
      uVar4 = local_80;
      iVar6 = iVar6 + -1;
      iVar5 = iVar5 + 1;
      if (!bVar8) {
        anon_unknown_0::Output
                  ("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n",
                   (double)*(float *)&(this_00->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper,
                   SUB84((double)*(float *)((long)&(this_00->super_SubcaseBase).super_GLWrapper.
                                                   _vptr_GLWrapper + 4),0),
                   (double)*(float *)&(this_00->super_SubcaseBase).super_GLWrapper.
                                      super_CallLogWrapper.m_gl,
                   (double)*(float *)((long)&(this_00->super_SubcaseBase).super_GLWrapper.
                                             super_CallLogWrapper.m_gl + 4),
                   (double)local_70->m_data[0],(double)local_70->m_data[1],
                   (double)local_70->m_data[2],(double)local_70->m_data[3],(ulong)(uint)-iVar6,
                   (ulong)local_80);
        goto LAB_00c219a4;
      }
    }
    uVar4 = local_80 + 1;
    iVar5 = local_74 + local_78;
    epsilon = (vec4 *)(ulong)local_7c;
  } while( true );
}

Assistant:

bool ValidateReadBuffer(int x, int y, int w, int h, const vec4& expected)
	{
		std::vector<vec4>	display(w * h);
		std::vector<GLubyte> data(w * h * 4);
		glReadPixels(x, y, w, h, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

		for (int i = 0; i < w * h * 4; i += 4)
		{
			display[i / 4] = vec4(static_cast<GLfloat>(data[i] / 255.), static_cast<GLfloat>(data[i + 1] / 255.),
								  static_cast<GLfloat>(data[i + 2] / 255.), static_cast<GLfloat>(data[i + 3] / 255.));
		}

		for (int j = 0; j < h; ++j)
		{
			for (int i = 0; i < w; ++i)
			{
				if (!ColorEqual(display[j * w + i], expected, g_color_eps))
				{
					Output("Color at (%d, %d) is [%f, %f, %f, %f] should be [%f, %f, %f, %f].\n", x + i, y + j,
						   display[j * w + i].x(), display[j * w + i].y(), display[j * w + i].z(),
						   display[j * w + i].w(), expected.x(), expected.y(), expected.z(), expected.w());
					return false;
				}
			}
		}

		return true;
	}